

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O3

VRString * __thiscall
MinVR::VRDatumString::getValueString_abi_cxx11_
          (VRString *__return_storage_ptr__,VRDatumString *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var1 = (this->
           super_VRDatumSpecialized<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(MinVR::VRCORETYPE_ID)3>
           ).value.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  p_Var2 = p_Var1[1]._M_next;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,p_Var2,
             (long)&(p_Var1[1]._M_prev)->_M_next + (long)p_Var2);
  return __return_storage_ptr__;
}

Assistant:

const VRString* getPointerString() const { return &(value.front()); }